

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_pipe_stop(void *arg)

{
  long lVar1;
  req0_sock *s;
  req0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_aio_stop((nni_aio *)((long)arg + 0x208));
  nni_aio_stop((nni_aio *)((long)arg + 0x40));
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x358));
  nni_list_node_remove((nni_list_node *)((long)arg + 0x10));
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
  return;
}

Assistant:

static void
req0_pipe_stop(void *arg)
{
	req0_pipe *p = arg;
	req0_sock *s = p->req;

	nni_aio_stop(&p->aio_recv);
	nni_aio_stop(&p->aio_send);
	nni_mtx_lock(&s->mtx);
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&s->mtx);
}